

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

bool ImGui::FocusableItemRegister(ImGuiWindow *window,ImGuiID id,bool tab_stop)

{
  uint uVar1;
  ImGuiContext *pIVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  
  pIVar2 = GImGui;
  uVar1 = (window->DC).ItemFlags;
  iVar4 = window->FocusIdxAllCounter + 1;
  window->FocusIdxAllCounter = iVar4;
  if ((uVar1 & 5) == 0) {
    window->FocusIdxTabCounter = window->FocusIdxTabCounter + 1;
  }
  if (((((tab_stop) && (pIVar2->ActiveId == id)) && (window->FocusIdxAllRequestNext == 0x7fffffff))
      && ((window->FocusIdxTabRequestNext == 0x7fffffff && ((pIVar2->IO).KeyCtrl == false)))) &&
     (iVar5 = (pIVar2->IO).KeyMap[0], -1 < iVar5)) {
    bVar3 = IsKeyPressed(iVar5,true);
    if (bVar3) {
      iVar5 = 1;
      if ((pIVar2->IO).KeyShift != false) {
        iVar5 = -(uint)((uVar1 & 5) == 0);
      }
      window->FocusIdxTabRequestNext = iVar5 + window->FocusIdxTabCounter;
    }
  }
  bVar3 = iVar4 == window->FocusIdxAllRequestCurrent;
  if ((!bVar3) && ((uVar1 & 5) == 0)) {
    if (window->FocusIdxTabCounter == window->FocusIdxTabRequestCurrent) {
      pIVar2->NavJustTabbedId = id;
      bVar3 = true;
    }
    else {
      bVar3 = false;
    }
  }
  return bVar3;
}

Assistant:

bool ImGui::FocusableItemRegister(ImGuiWindow* window, ImGuiID id, bool tab_stop)
{
    ImGuiContext& g = *GImGui;

    const bool is_tab_stop = (window->DC.ItemFlags & (ImGuiItemFlags_NoTabStop | ImGuiItemFlags_Disabled)) == 0;
    window->FocusIdxAllCounter++;
    if (is_tab_stop)
        window->FocusIdxTabCounter++;

    // Process keyboard input at this point: TAB/Shift-TAB to tab out of the currently focused item.
    // Note that we can always TAB out of a widget that doesn't allow tabbing in.
    if (tab_stop && (g.ActiveId == id) && window->FocusIdxAllRequestNext == INT_MAX && window->FocusIdxTabRequestNext == INT_MAX && !g.IO.KeyCtrl && IsKeyPressedMap(ImGuiKey_Tab))
        window->FocusIdxTabRequestNext = window->FocusIdxTabCounter + (g.IO.KeyShift ? (is_tab_stop ? -1 : 0) : +1); // Modulo on index will be applied at the end of frame once we've got the total counter of items.

    if (window->FocusIdxAllCounter == window->FocusIdxAllRequestCurrent)
        return true;
    if (is_tab_stop && window->FocusIdxTabCounter == window->FocusIdxTabRequestCurrent)
    {
        g.NavJustTabbedId = id;
        return true;
    }

    return false;
}